

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cash.cpp
# Opt level: O0

void __thiscall Cash::display(Cash *this)

{
  _Setprecision _Var1;
  ostream *poVar2;
  Cash *this_local;
  
  Transaction::display(&this->super_Transaction);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var1 = std::setprecision(2);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"\tPayment Method: Cash");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"\tAmount Paid: $");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->totalPaid);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"\tChange due: $");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->changeDue);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Cash::display() const
{
    Transaction::display();

    cout << fixed << setprecision(2) << "\tPayment Method: Cash" << endl << "\tAmount Paid: $" << totalPaid << endl << "\tChange due: $" << changeDue << endl;
}